

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# returnperiodtobin.cpp
# Opt level: O2

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  int return_period;
  char line [4096];
  value_type local_103c;
  char local_1038 [4104];
  
  fgets(local_1038,0x1000,_stdin);
  uVar3 = 0;
  while( true ) {
    pcVar2 = fgets(local_1038,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      writereturnperiods();
      return;
    }
    iVar1 = __isoc99_sscanf(local_1038,"%d",&local_103c);
    if (iVar1 != 1) break;
    std::vector<int,_std::allocator<int>_>::push_back(&return_periods,&local_103c);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,local_1038);
  return;
}

Assistant:

void doit()
{
    int return_period;
    char line[4096];
    int lineno=0;
	fgets(line, sizeof(line), stdin);	// skip first line
    while (fgets(line, sizeof(line), stdin) != 0)
    {
       if (sscanf(line, "%d", &return_period) != 1){
           fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
           return;
       }
       else
       {           
		   return_periods.push_back(return_period);
       }
       lineno++;
    }
	writereturnperiods();
}